

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_msg_internal_free(fio_msg_internal_s *m)

{
  uintptr_t *puVar1;
  size_t sVar2;
  undefined4 local_78 [2];
  size_t local_70;
  size_t sStack_68;
  char *local_60;
  size_t local_58;
  size_t sStack_50;
  char *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  LOCK();
  puVar1 = &m->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    while (sVar2 = m->meta_len, sVar2 != 0) {
      m->meta_len = sVar2 - 1;
      if (*(code **)(&m->filter + sVar2 * 6) != (code *)0x0) {
        local_78[0] = 0;
        local_60 = (m->channel).data;
        local_70 = (m->channel).capa;
        sStack_68 = (m->channel).len;
        local_48 = (m->data).data;
        local_58 = (m->data).capa;
        sStack_50 = (m->data).len;
        local_40 = 0;
        uStack_38 = 0;
        local_30 = 0;
        (**(code **)(&m->filter + sVar2 * 6))(local_78,(&m->meta_len)[sVar2 * 3]);
      }
    }
    fio_free(m);
  }
  return;
}

Assistant:

static inline void fio_msg_internal_free(fio_msg_internal_s *m) {
  if (fio_atomic_sub(&m->ref, 1))
    return;
  while (m->meta_len) {
    --m->meta_len;
    if (m->meta[m->meta_len].on_finish) {
      fio_msg_s tmp_msg = {
          .channel = m->channel,
          .msg = m->data,
      };
      m->meta[m->meta_len].on_finish(&tmp_msg, m->meta[m->meta_len].metadata);
    }
  }
  fio_free(m);
}